

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::no_square_brackets::no_square_brackets(no_square_brackets *this)

{
  no_square_brackets *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture =
       (_func_int **)&PTR__no_square_brackets_0032e120;
  return;
}

Assistant:

void test()
      {
      std::string script = R"(
(do ((vec (make-vector 5)) (i 0 (+ i 1)))
    ((= i 5) vec)
    (vector-set! vec i i))
)";
      TEST_EQ("#(0 1 2 3 4)", run(script));
      TEST_EQ("13", run("(cond(#f)(#f 12)(12 13)) "));
      TEST_EQ("1287", run("(let((b #t))(cond (else 1287))) "));
      TEST_EQ("2", run("(cond((cons 1 2) => (lambda(x) (cdr x)))) "));

      TEST_EQ("75", run("(case (+ 7 3) ((10 11 12) 75))"));
      TEST_EQ("41", run("(letrec ((f (lambda (x y) (+ x y))) (g (lambda(x) (+ x 12))))(f 16 (f (g 0) (+ 1 (g 0)))))"));
      }